

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jccolor.c
# Opt level: O1

void rgb_gray_convert(j_decompress_ptr cinfo,JSAMPIMAGE input_buf,JDIMENSION input_row,
                     JSAMPARRAY output_buf,int num_rows)

{
  uint uVar1;
  _func_void_j_decompress_ptr *p_Var2;
  JSAMPROW pJVar3;
  JSAMPROW pJVar4;
  JSAMPROW pJVar5;
  JSAMPROW pJVar6;
  bool bVar7;
  ulong uVar8;
  
  if (0 < num_rows) {
    p_Var2 = cinfo->cconvert[3].start_pass;
    uVar1 = cinfo->output_width;
    do {
      if ((ulong)uVar1 != 0) {
        pJVar3 = (*input_buf)[input_row];
        pJVar4 = input_buf[1][input_row];
        pJVar5 = input_buf[2][input_row];
        pJVar6 = *output_buf;
        uVar8 = 0;
        do {
          pJVar6[uVar8] =
               (JSAMPLE)((uint)(*(int *)(p_Var2 + (ulong)pJVar4[uVar8] * 8 + 0x800) +
                                *(int *)(p_Var2 + (ulong)pJVar3[uVar8] * 8) +
                               *(int *)(p_Var2 + (ulong)pJVar5[uVar8] * 8 + 0x1000)) >> 0x10);
          uVar8 = uVar8 + 1;
        } while (uVar1 != uVar8);
      }
      input_row = input_row + 1;
      output_buf = output_buf + 1;
      bVar7 = 1 < num_rows;
      num_rows = num_rows + -1;
    } while (bVar7);
  }
  return;
}

Assistant:

METHODDEF(void)
rgb_gray_convert(j_compress_ptr cinfo, JSAMPARRAY input_buf,
                 JSAMPIMAGE output_buf, JDIMENSION output_row, int num_rows)
{
  switch (cinfo->in_color_space) {
  case JCS_EXT_RGB:
    extrgb_gray_convert_internal(cinfo, input_buf, output_buf, output_row,
                                 num_rows);
    break;
  case JCS_EXT_RGBX:
  case JCS_EXT_RGBA:
    extrgbx_gray_convert_internal(cinfo, input_buf, output_buf, output_row,
                                  num_rows);
    break;
  case JCS_EXT_BGR:
    extbgr_gray_convert_internal(cinfo, input_buf, output_buf, output_row,
                                 num_rows);
    break;
  case JCS_EXT_BGRX:
  case JCS_EXT_BGRA:
    extbgrx_gray_convert_internal(cinfo, input_buf, output_buf, output_row,
                                  num_rows);
    break;
  case JCS_EXT_XBGR:
  case JCS_EXT_ABGR:
    extxbgr_gray_convert_internal(cinfo, input_buf, output_buf, output_row,
                                  num_rows);
    break;
  case JCS_EXT_XRGB:
  case JCS_EXT_ARGB:
    extxrgb_gray_convert_internal(cinfo, input_buf, output_buf, output_row,
                                  num_rows);
    break;
  default:
    rgb_gray_convert_internal(cinfo, input_buf, output_buf, output_row,
                              num_rows);
    break;
  }
}